

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile_net.c
# Opt level: O0

hFILE * hopen_net(char *filename,char *mode)

{
  int iVar1;
  knetFile *pkVar2;
  hFILE_net *fp;
  char *mode_local;
  char *filename_local;
  
  if ((net_inited == 0) && (iVar1 = net_init(), iVar1 < 0)) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)hfile_init(0x40,mode,0);
    if ((hFILE *)filename_local == (hFILE *)0x0) {
      filename_local = (char *)0x0;
    }
    else {
      pkVar2 = knet_open(filename,mode);
      ((hFILE *)((long)filename_local + 0x38))->buffer = (char *)pkVar2;
      if (((hFILE *)((long)filename_local + 0x38))->buffer == (char *)0x0) {
        hfile_destroy((hFILE *)filename_local);
        filename_local = (char *)0x0;
      }
      else {
        ((hFILE *)filename_local)->backend = &net_backend;
      }
    }
  }
  return (hFILE *)filename_local;
}

Assistant:

hFILE *hopen_net(const char *filename, const char *mode)
{
    hFILE_net *fp;

    // Do any networking initialisation if this is the first use.
    if (! net_inited) { if (net_init() < 0) return NULL; }

    fp = (hFILE_net *) hfile_init(sizeof (hFILE_net), mode, 0);
    if (fp == NULL) return NULL;

    fp->netfp = knet_open(filename, mode);
    if (fp->netfp == NULL) { hfile_destroy((hFILE *) fp); return NULL; }

    fp->base.backend = &net_backend;
    return &fp->base;
}